

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNewFixed
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArrayNewFixed *curr)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  Type local_50 [2];
  uintptr_t local_40;
  ConstraintCollector *local_38;
  
  local_38 = (ConstraintCollector *)this;
  local_40 = (uintptr_t)
             wasm::Type::getHeapType
                       (&(curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression
                         .type);
  HeapType::getArray((HeapType *)local_50);
  sVar1 = (curr->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements;
  if (sVar1 != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if ((curr->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= uVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                (local_38,(Expression **)
                          ((long)(curr->values).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 .data + lVar2),local_50[0]);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 8;
    } while (sVar1 != uVar3);
  }
  return;
}

Assistant:

void visitArrayNewFixed(ArrayNewFixed* curr) {
    auto type = curr->type.getHeapType().getArray().element.type;
    for (auto& expr : curr->values) {
      note(&expr, type);
    }
  }